

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralActivity::IfcStructuralActivity(IfcStructuralActivity *this)

{
  *(undefined ***)&this->field_0x138 = &PTR__Object_007e4a70;
  *(undefined8 *)&this->field_0x140 = 0;
  *(char **)&this->field_0x148 = "IfcStructuralActivity";
  IfcProduct::IfcProduct(&this->super_IfcProduct,&PTR_construction_vtable_24__0081e2c0);
  *(undefined8 *)&(this->super_IfcProduct).field_0x108 = 0;
  *(undefined8 *)&(this->super_IfcProduct).field_0x110 = 0;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject = 0x81e1e0;
  *(undefined8 *)&this->field_0x138 = 0x81e2a8;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0x88 = 0x81e208;
  (this->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x81e230;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0xd0 = 0x81e258;
  *(undefined8 *)&(this->super_IfcProduct).field_0x100 = 0x81e280;
  (this->GlobalOrLocal)._M_dataplus._M_p = (pointer)&(this->GlobalOrLocal).field_2;
  (this->GlobalOrLocal)._M_string_length = 0;
  (this->GlobalOrLocal).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

IfcStructuralActivity() : Object("IfcStructuralActivity") {}